

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSweep.c
# Opt level: O1

void Dch_ManSweep(Dch_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  Aig_Obj_t **__ptr;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Bar_Progress_t *p_00;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar9;
  long lVar10;
  
  pAVar4 = Aig_ManStart(p->pAigTotal->vObjs->nSize);
  p->pAigFraig = pAVar4;
  Aig_ManCleanData(p->pAigTotal);
  p->pAigTotal->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pAigFraig->pConst1;
  pAVar4 = p->pAigTotal;
  pVVar6 = pAVar4->vCis;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar10];
      pAVar5 = Aig_ObjCreateCi(p->pAigFraig);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar10 = lVar10 + 1;
      pAVar4 = p->pAigTotal;
      pVVar6 = pAVar4->vCis;
    } while (lVar10 < pVVar6->nSize);
  }
  p_00 = Bar_ProgressStart(_stdout,pAVar4->vObjs->nSize);
  pVVar6 = p->pAigTotal->vObjs;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pAVar5 = (Aig_Obj_t *)pVVar6->pArray[lVar10];
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        if ((p_00 == (Bar_Progress_t *)0x0) || (p_00->nItemsNext <= lVar10)) {
          Bar_ProgressUpdate_int(p_00,(int)lVar10,(char *)0x0);
        }
        uVar8 = (ulong)pAVar5->pFanin0 & 0xfffffffffffffffe;
        uVar2 = *(ulong *)(uVar8 + 0x28);
        if (uVar2 != 0) {
          uVar7 = (ulong)pAVar5->pFanin1 & 0xfffffffffffffffe;
          uVar3 = *(ulong *)(uVar7 + 0x28);
          if (uVar3 != 0) {
            if (((ulong)pAVar5 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchSweep.c"
                            ,0x1f,"Aig_Obj_t *Dch_ObjChild0Fra(Aig_Obj_t *)");
            }
            pAVar9 = (Aig_Obj_t *)((uint)pAVar5->pFanin0 & 1 ^ uVar2);
            if (uVar8 == 0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            p1 = (Aig_Obj_t *)((uint)pAVar5->pFanin1 & 1 ^ uVar3);
            if (uVar7 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            pAVar9 = Aig_And(p->pAigFraig,pAVar9,p1);
            if (pAVar9 != (Aig_Obj_t *)0x0) {
              (pAVar5->field_5).pData = pAVar9;
              Dch_ManSweepNode(p,pAVar5);
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = p->pAigTotal->vObjs;
    } while (lVar10 < pVVar6->nSize);
  }
  Bar_ProgressStop(p_00);
  __ptr = p->pAigTotal->pReprs;
  if (__ptr != (Aig_Obj_t **)0x0) {
    free(__ptr);
    p->pAigTotal->pReprs = (Aig_Obj_t **)0x0;
  }
  pAVar4 = p->pAigTotal;
  pAVar4->pReprs = p->pReprsProved;
  p->pReprsProved = (Aig_Obj_t **)0x0;
  Aig_ManCleanMarkB(pAVar4);
  return;
}

Assistant:

void Dch_ManSweep( Dch_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    // map constants and PIs
    p->pAigFraig = Aig_ManStart( Aig_ManObjNumMax(p->pAigTotal) );
    Aig_ManCleanData( p->pAigTotal );
    Aig_ManConst1(p->pAigTotal)->pData = Aig_ManConst1(p->pAigFraig);
    Aig_ManForEachCi( p->pAigTotal, pObj, i )
        pObj->pData = Aig_ObjCreateCi( p->pAigFraig );
    // sweep internal nodes
    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAigTotal) );
    Aig_ManForEachNode( p->pAigTotal, pObj, i )
    {
        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Dch_ObjFraig(Aig_ObjFanin0(pObj)) == NULL || 
             Dch_ObjFraig(Aig_ObjFanin1(pObj)) == NULL )
            continue;
        pObjNew = Aig_And( p->pAigFraig, Dch_ObjChild0Fra(pObj), Dch_ObjChild1Fra(pObj) );
        if ( pObjNew == NULL )
            continue;
        Dch_ObjSetFraig( pObj, pObjNew );
        Dch_ManSweepNode( p, pObj );
    }
    Bar_ProgressStop( pProgress );
    // update the representatives of the nodes (makes classes invalid)
    ABC_FREE( p->pAigTotal->pReprs );
    p->pAigTotal->pReprs = p->pReprsProved;
    p->pReprsProved = NULL;
    // clean the mark
    Aig_ManCleanMarkB( p->pAigTotal );
}